

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O0

void discordpp::from_json
               (json *j,field<std::vector<discordpp::ForumTag,_std::allocator<discordpp::ForumTag>_>_>
                        *f)

{
  bool bVar1;
  vector<discordpp::ForumTag,_std::allocator<discordpp::ForumTag>_> local_38;
  pointer local_18;
  field<std::vector<discordpp::ForumTag,_std::allocator<discordpp::ForumTag>_>_> *f_local;
  json *j_local;
  
  local_18 = (pointer)f;
  f_local = (field<std::vector<discordpp::ForumTag,_std::allocator<discordpp::ForumTag>_>_> *)j;
  bVar1 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::is_null(j);
  if (bVar1) {
    std::
    unique_ptr<std::vector<discordpp::ForumTag,_std::allocator<discordpp::ForumTag>_>,_std::default_delete<std::vector<discordpp::ForumTag,_std::allocator<discordpp::ForumTag>_>_>_>
    ::operator=((unique_ptr<std::vector<discordpp::ForumTag,_std::allocator<discordpp::ForumTag>_>,_std::default_delete<std::vector<discordpp::ForumTag,_std::allocator<discordpp::ForumTag>_>_>_>
                 *)local_18,(nullptr_t)0x0);
    (local_18->id).s_ = nulled_e;
  }
  else {
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::
    get<std::vector<discordpp::ForumTag,std::allocator<discordpp::ForumTag>>,std::vector<discordpp::ForumTag,std::allocator<discordpp::ForumTag>>>
              (&local_38,
               (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)f_local);
    std::
    make_unique<std::vector<discordpp::ForumTag,std::allocator<discordpp::ForumTag>>,std::vector<discordpp::ForumTag,std::allocator<discordpp::ForumTag>>>
              ((vector<discordpp::ForumTag,_std::allocator<discordpp::ForumTag>_> *)
               &stack0xffffffffffffffe0);
    std::
    unique_ptr<std::vector<discordpp::ForumTag,_std::allocator<discordpp::ForumTag>_>,_std::default_delete<std::vector<discordpp::ForumTag,_std::allocator<discordpp::ForumTag>_>_>_>
    ::operator=((unique_ptr<std::vector<discordpp::ForumTag,_std::allocator<discordpp::ForumTag>_>,_std::default_delete<std::vector<discordpp::ForumTag,_std::allocator<discordpp::ForumTag>_>_>_>
                 *)local_18,
                (unique_ptr<std::vector<discordpp::ForumTag,_std::allocator<discordpp::ForumTag>_>,_std::default_delete<std::vector<discordpp::ForumTag,_std::allocator<discordpp::ForumTag>_>_>_>
                 *)&stack0xffffffffffffffe0);
    std::
    unique_ptr<std::vector<discordpp::ForumTag,_std::allocator<discordpp::ForumTag>_>,_std::default_delete<std::vector<discordpp::ForumTag,_std::allocator<discordpp::ForumTag>_>_>_>
    ::~unique_ptr((unique_ptr<std::vector<discordpp::ForumTag,_std::allocator<discordpp::ForumTag>_>,_std::default_delete<std::vector<discordpp::ForumTag,_std::allocator<discordpp::ForumTag>_>_>_>
                   *)&stack0xffffffffffffffe0);
    std::vector<discordpp::ForumTag,_std::allocator<discordpp::ForumTag>_>::~vector(&local_38);
    (local_18->id).s_ = present_e;
  }
  return;
}

Assistant:

void from_json(const nlohmann::json &j, field<T> &f) {
        if (j.is_null()) {
            f.t_ = nullptr;
            f.s_ = nulled_e;
        } else {
            f.t_ = std::make_unique<T>(j.get<T>());
            f.s_ = present_e;
        }
    }